

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.h
# Opt level: O3

Any __thiscall Jinx::Impl::Script::GetUserContext(Script *this)

{
  _Storage in_RDX;
  _Storage extraout_RDX;
  long in_RSI;
  Any AVar1;
  _Arg __arg;
  
  (this->super_enable_shared_from_this<Jinx::Impl::Script>)._M_weak_this.
  super___weak_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  if (*(code **)(in_RSI + 0x10f0) == (code *)0x0) {
    (this->super_IScript)._vptr_IScript = (_func_int **)0x0;
  }
  else {
    (**(code **)(in_RSI + 0x10f0))(2,in_RSI + 0x10f0);
    in_RDX = extraout_RDX;
  }
  AVar1._M_storage._M_ptr = in_RDX._M_ptr;
  AVar1._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)this;
  return AVar1;
}

Assistant:

Any GetUserContext() const override { return m_userContext; }